

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_types.cc
# Opt level: O0

void __thiscall webrtc::RTPHeaderExtension::RTPHeaderExtension(RTPHeaderExtension *this)

{
  RTPHeaderExtension *this_local;
  
  this->hasTransmissionTimeOffset = false;
  this->transmissionTimeOffset = 0;
  this->hasAbsoluteSendTime = false;
  this->absoluteSendTime = 0;
  this->hasTransportSequenceNumber = false;
  this->transportSequenceNumber = 0;
  this->hasAudioLevel = false;
  this->voiceActivity = false;
  this->audioLevel = '\0';
  this->hasVideoRotation = false;
  this->videoRotation = '\0';
  return;
}

Assistant:

RTPHeaderExtension::RTPHeaderExtension()
    : hasTransmissionTimeOffset(false),
      transmissionTimeOffset(0),
      hasAbsoluteSendTime(false),
      absoluteSendTime(0),
      hasTransportSequenceNumber(false),
      transportSequenceNumber(0),
      hasAudioLevel(false),
      voiceActivity(false),
      audioLevel(0),
      hasVideoRotation(false),
      videoRotation(0) {
}